

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O2

const_iterator __thiscall
cppjieba::HMMSegment::SequentialLetterRule(HMMSegment *this,const_iterator begin,const_iterator end)

{
  const_iterator pRVar1;
  
  if ((begin->rune & 0xffffffdf) - 0x41 < 0x1a) {
    pRVar1 = begin + 1;
    do {
      begin = pRVar1;
      if (begin == end) {
        return begin;
      }
      pRVar1 = begin + 1;
    } while ((begin->rune - 0x30 < 10) || ((begin->rune & 0xffffffdf) - 0x41 < 0x1a));
  }
  return begin;
}

Assistant:

RuneStrArray::const_iterator SequentialLetterRule(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end) const {
    Rune x = begin->rune;
    if (('a' <= x && x <= 'z') || ('A' <= x && x <= 'Z')) {
      begin ++;
    } else {
      return begin;
    }
    while (begin != end) {
      x = begin->rune;
      if (('a' <= x && x <= 'z') || ('A' <= x && x <= 'Z') || ('0' <= x && x <= '9')) {
        begin ++;
      } else {
        break;
      }
    }
    return begin;
  }